

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O3

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,OpType *args_1,
          shared_ptr<mocker::ir::Addr> *args_2,shared_ptr<mocker::ir::Addr> *args_3)

{
  shared_ptr<mocker::ir::ArithBinaryInst> inst;
  undefined1 local_39;
  ArithBinaryInst *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<mocker::ir::IRInst> local_28;
  
  local_38 = (ArithBinaryInst *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>>
            (&_Stack_30,&local_38,(allocator<mocker::ir::ArithBinaryInst> *)&local_39,args,args_1,
             args_2,args_3);
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_IRInst;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (ArithBinaryInst *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_28);
  if (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }